

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

u32 dec_parse_abs_mvd(com_lbac_t *lbac,lbac_ctx_model_t *model)

{
  byte bVar1;
  byte bVar2;
  byte *pbVar3;
  u32 uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  byte *pbVar12;
  uint uVar13;
  
  uVar4 = lbac_dec_bin(lbac,model);
  if (uVar4 == 0) {
    uVar4 = 0;
  }
  else {
    uVar4 = lbac_dec_bin(lbac,model + 1);
    if (uVar4 == 0) {
      uVar4 = 1;
    }
    else {
      uVar4 = lbac_dec_bin(lbac,model + 2);
      if (uVar4 == 0) {
        uVar4 = 2;
      }
      else {
        uVar4 = lbac_dec_bin_ep(lbac);
        iVar9 = lbac->range * 0x10000;
        uVar13 = lbac->low;
        iVar6 = 0;
        do {
          iVar7 = iVar6;
          uVar10 = uVar13;
          iVar6 = iVar9;
          if ((int)uVar10 <= iVar9) {
            iVar6 = 0;
          }
          uVar13 = (uVar10 - iVar6) * 2;
          if ((uVar10 & 0x7fff) == 0) {
            uVar5 = (int)(uVar13 - 1 ^ uVar13) >> 0xf;
            iVar6 = 0x1f;
            if (uVar5 != 0) {
              for (; uVar5 >> iVar6 == 0; iVar6 = iVar6 + -1) {
              }
            }
            pbVar3 = lbac->cur;
            bVar1 = *pbVar3;
            bVar2 = pbVar3[1];
            pbVar12 = pbVar3 + 2;
            if (lbac->end <= pbVar3 + 2) {
              pbVar12 = lbac->end;
            }
            lbac->cur = pbVar12;
            uVar13 = ((uint)bVar1 * 0x200 + (uint)bVar2 * 2 + -0xffff <<
                     (0x1e - ((byte)iVar6 ^ 0x1f) & 0x1f)) + uVar13;
          }
          iVar6 = (uint)((int)uVar10 <= iVar9) + iVar7;
        } while (((int)uVar10 <= iVar9) && (lbac->cur < lbac->end));
        lbac->low = uVar13;
        if (iVar6 < 1) {
          iVar7 = 0;
        }
        else {
          iVar11 = iVar7 + (uint)((int)uVar10 <= iVar9) + 1;
          iVar7 = 0;
          uVar10 = uVar13;
          do {
            iVar8 = 0;
            if (iVar9 < (int)uVar10) {
              iVar8 = iVar9;
            }
            uVar13 = (uVar10 - iVar8) * 2;
            if ((uVar10 & 0x7fff) == 0) {
              uVar5 = (int)(uVar13 - 1 ^ uVar13) >> 0xf;
              iVar8 = 0x1f;
              if (uVar5 != 0) {
                for (; uVar5 >> iVar8 == 0; iVar8 = iVar8 + -1) {
                }
              }
              pbVar3 = lbac->cur;
              bVar1 = *pbVar3;
              bVar2 = pbVar3[1];
              pbVar12 = pbVar3 + 2;
              if (lbac->end <= pbVar3 + 2) {
                pbVar12 = lbac->end;
              }
              lbac->cur = pbVar12;
              uVar13 = ((uint)bVar1 * 0x200 + (uint)bVar2 * 2 + -0xffff <<
                       (0x1e - ((byte)iVar8 ^ 0x1f) & 0x1f)) + uVar13;
            }
            iVar7 = (uint)(iVar9 < (int)uVar10) + iVar7 * 2;
            iVar11 = iVar11 + -1;
            uVar10 = uVar13;
          } while (1 < iVar11);
        }
        lbac->low = uVar13;
        uVar4 = (uVar4 & 1) + (iVar7 + ~(-1 << ((byte)iVar6 & 0x1f))) * 2 + 3;
      }
    }
  }
  return uVar4;
}

Assistant:

static u32 dec_parse_abs_mvd(com_lbac_t *lbac, lbac_ctx_model_t *model)
{
    u32 act_sym;

    if (!lbac_dec_bin(lbac, model)) {
        act_sym = 0;
    } else if (!lbac_dec_bin(lbac, model + 1)) {
        act_sym = 1;
    } else if (!lbac_dec_bin(lbac, model + 2)) {
        act_sym = 2;
    } else {
        int add_one = lbac_dec_bin_ep(lbac) & 1;
        int golomb_order = lbac_read_unary_sym_ep(lbac);
        act_sym = (1 << golomb_order) - 1 + lbac_read_bins_ep_msb(lbac, golomb_order);
        act_sym = 3 + act_sym * 2 + add_one;
    }

    return act_sym;
}